

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O2

bool __thiscall OpenMD::SelectionCompiler::clauseNot(SelectionCompiler *this)

{
  bool bVar1;
  int iVar2;
  Token tokenNot;
  Token TStack_28;
  
  iVar2 = tokPeek(this);
  if (iVar2 == 0x405) {
    tokenNext(&TStack_28,this);
    bVar1 = clauseNot(this);
    if (bVar1) {
      std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::push_back
                (&this->ltokenPostfix,&TStack_28);
    }
    std::any::reset(&TStack_28.value);
    return bVar1;
  }
  bVar1 = clausePrimitive(this);
  return bVar1;
}

Assistant:

bool SelectionCompiler::clauseNot() {
    if (tokPeek() == Token::opNot) {
      Token tokenNot = tokenNext();
      if (!clauseNot()) { return false; }
      return addTokenToPostfix(tokenNot);
    }
    return clausePrimitive();
  }